

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L3_imdct36(float *grbuf,float *overlap,float *window,int nbands)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float sum;
  float ovl;
  f4 vsum;
  f4 vw1;
  f4 vw0;
  f4 vr1;
  f4 vr0;
  f4 vs;
  f4 vc;
  f4 vovl;
  float si [9];
  float co [9];
  int j;
  int i;
  float local_298;
  uint local_294;
  undefined8 uStack_290;
  float fStack_288;
  uint local_284;
  uint local_27c;
  float local_268 [2];
  undefined8 auStack_260 [3];
  int local_244;
  int local_240;
  int local_23c;
  long local_238;
  long local_230;
  float *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  float *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float *local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_23c = in_ECX;
  local_238 = in_RDX;
  local_230 = in_RSI;
  local_228 = in_RDI;
  for (local_244 = 0; local_244 < local_23c; local_244 = local_244 + 1) {
    local_268[0] = -*local_228;
    local_298 = local_228[0x11];
    for (local_240 = 0; local_240 < 4; local_240 = local_240 + 1) {
      (&local_298)[local_240 * -2 + 8] = local_228[local_240 * 4 + 1] - local_228[local_240 * 4 + 2]
      ;
      local_268[local_240 * 2 + 1] = local_228[local_240 * 4 + 1] + local_228[local_240 * 4 + 2];
      (&local_298)[local_240 * -2 + 7] = local_228[local_240 * 4 + 4] - local_228[local_240 * 4 + 3]
      ;
      local_268[local_240 * 2 + 2] = -(local_228[local_240 * 4 + 3] + local_228[local_240 * 4 + 4]);
    }
    L3_dct3_9(local_268);
    L3_dct3_9(&local_298);
    local_294 = local_294 ^ 0x80000000;
    uStack_290._4_4_ = uStack_290._4_4_ ^ 0x80000000;
    local_284 = local_284 ^ 0x80000000;
    local_27c = local_27c ^ 0x80000000;
    local_240 = 0;
    iVar15 = have_simd();
    if (iVar15 != 0) {
      for (; local_240 < 8; local_240 = local_240 + 4) {
        local_1f0 = (undefined8 *)(local_230 + (long)local_240 * 4);
        local_d8 = *local_1f0;
        uStack_d0 = local_1f0[1];
        local_1f8 = local_268 + local_240;
        local_58 = *(undefined8 *)(local_268 + local_240);
        uStack_50 = *(undefined8 *)((long)auStack_260 + (long)local_240 * 4);
        local_200 = &local_298 + local_240;
        local_78 = *(undefined8 *)(&local_298 + local_240);
        uStack_70 = *(undefined8 *)((long)&uStack_290 + (long)local_240 * 4);
        local_208 = L3_imdct36::g_twid9 + local_240;
        local_68 = *(undefined8 *)(L3_imdct36::g_twid9 + local_240);
        uStack_60 = *(undefined8 *)(L3_imdct36::g_twid9 + (long)local_240 + 2);
        local_210 = L3_imdct36::g_twid9 + (long)local_240 + 9;
        local_88 = *(undefined8 *)(L3_imdct36::g_twid9 + (long)local_240 + 9);
        uStack_80 = *(undefined8 *)(L3_imdct36::g_twid9 + (long)local_240 + 0xb);
        local_218 = (undefined8 *)(local_238 + (long)local_240 * 4);
        local_108 = *local_218;
        uStack_100 = local_218[1];
        local_220 = (undefined8 *)(local_238 + 0x24 + (long)local_240 * 4);
        local_e8 = *local_220;
        uStack_e0 = local_220[1];
        local_18 = local_58;
        uVar13 = local_18;
        uStack_10 = uStack_50;
        uVar14 = uStack_10;
        local_28 = local_88;
        uVar11 = local_28;
        uStack_20 = uStack_80;
        uVar12 = uStack_20;
        local_18._0_4_ = (float)local_58;
        local_18._4_4_ = (float)((ulong)local_58 >> 0x20);
        uStack_10._0_4_ = (float)uStack_50;
        uStack_10._4_4_ = (float)((ulong)uStack_50 >> 0x20);
        local_28._0_4_ = (float)local_88;
        local_28._4_4_ = (float)((ulong)local_88 >> 0x20);
        uStack_20._0_4_ = (float)uStack_80;
        uStack_20._4_4_ = (float)((ulong)uStack_80 >> 0x20);
        local_38 = local_78;
        uVar9 = local_38;
        uStack_30 = uStack_70;
        uVar10 = uStack_30;
        local_48 = local_68;
        uVar7 = local_48;
        uStack_40 = uStack_60;
        uVar8 = uStack_40;
        local_38._0_4_ = (float)local_78;
        local_38._4_4_ = (float)((ulong)local_78 >> 0x20);
        uStack_30._0_4_ = (float)uStack_70;
        uStack_30._4_4_ = (float)((ulong)uStack_70 >> 0x20);
        local_48._0_4_ = (float)local_68;
        local_48._4_4_ = (float)((ulong)local_68 >> 0x20);
        uStack_40._0_4_ = (float)uStack_60;
        uStack_40._4_4_ = (float)((ulong)uStack_60 >> 0x20);
        local_158 = (float)local_18 * (float)local_28;
        fStack_154 = local_18._4_4_ * local_28._4_4_;
        fStack_150 = (float)uStack_10 * (float)uStack_20;
        fStack_14c = uStack_10._4_4_ * uStack_20._4_4_;
        local_168 = (float)local_38 * (float)local_48;
        fStack_164 = local_38._4_4_ * local_48._4_4_;
        fStack_160 = (float)uStack_30 * (float)uStack_40;
        fStack_15c = uStack_30._4_4_ * uStack_40._4_4_;
        fVar16 = (float)local_18 * (float)local_28 + (float)local_38 * (float)local_48;
        fVar17 = local_18._4_4_ * local_28._4_4_ + local_38._4_4_ * local_48._4_4_;
        fVar18 = (float)uStack_10 * (float)uStack_20 + (float)uStack_30 * (float)uStack_40;
        fVar19 = uStack_10._4_4_ * uStack_20._4_4_ + uStack_30._4_4_ * uStack_40._4_4_;
        local_190 = (undefined8 *)(local_230 + (long)local_240 * 4);
        local_118 = (float)local_18 * (float)local_48;
        fStack_114 = local_18._4_4_ * local_48._4_4_;
        fStack_110 = (float)uStack_10 * (float)uStack_40;
        fStack_10c = uStack_10._4_4_ * uStack_40._4_4_;
        local_128 = (float)local_38 * (float)local_28;
        fStack_124 = local_38._4_4_ * local_28._4_4_;
        fStack_120 = (float)uStack_30 * (float)uStack_20;
        fStack_11c = uStack_30._4_4_ * uStack_20._4_4_;
        local_1a8 = (float)local_18 * (float)local_48 - (float)local_38 * (float)local_28;
        fStack_1a4 = local_18._4_4_ * local_48._4_4_ - local_38._4_4_ * local_28._4_4_;
        fStack_1a0 = (float)uStack_10 * (float)uStack_40 - (float)uStack_30 * (float)uStack_20;
        fStack_19c = uStack_10._4_4_ * uStack_40._4_4_ - uStack_30._4_4_ * uStack_20._4_4_;
        *local_190 = CONCAT44(fStack_1a4,local_1a8);
        local_190[1] = CONCAT44(fStack_19c,fStack_1a0);
        local_1b0 = local_228 + local_240;
        local_98 = local_d8;
        uVar5 = local_98;
        uStack_90 = uStack_d0;
        uVar6 = uStack_90;
        local_a8 = local_108;
        uVar3 = local_a8;
        uStack_a0 = uStack_100;
        uVar4 = uStack_a0;
        local_98._0_4_ = (float)local_d8;
        local_98._4_4_ = (float)((ulong)local_d8 >> 0x20);
        uStack_90._0_4_ = (float)uStack_d0;
        uStack_90._4_4_ = (float)((ulong)uStack_d0 >> 0x20);
        local_a8._0_4_ = (float)local_108;
        local_a8._4_4_ = (float)((ulong)local_108 >> 0x20);
        uStack_a0._0_4_ = (float)uStack_100;
        uStack_a0._4_4_ = (float)((ulong)uStack_100 >> 0x20);
        local_b8 = CONCAT44(fVar17,fVar16);
        uStack_b0 = CONCAT44(fVar19,fVar18);
        local_c8 = local_e8;
        uVar1 = local_c8;
        uStack_c0 = uStack_e0;
        uVar2 = uStack_c0;
        local_c8._0_4_ = (float)local_e8;
        local_c8._4_4_ = (float)((ulong)local_e8 >> 0x20);
        uStack_c0._0_4_ = (float)uStack_e0;
        uStack_c0._4_4_ = (float)((ulong)uStack_e0 >> 0x20);
        local_138 = (float)local_98 * (float)local_a8;
        fStack_134 = local_98._4_4_ * local_a8._4_4_;
        fStack_130 = (float)uStack_90 * (float)uStack_a0;
        fStack_12c = uStack_90._4_4_ * uStack_a0._4_4_;
        local_148 = fVar16 * (float)local_c8;
        fStack_144 = fVar17 * local_c8._4_4_;
        fStack_140 = fVar18 * (float)uStack_c0;
        fStack_13c = fVar19 * uStack_c0._4_4_;
        local_1c8 = (float)local_98 * (float)local_a8 - fVar16 * (float)local_c8;
        fStack_1c4 = local_98._4_4_ * local_a8._4_4_ - fVar17 * local_c8._4_4_;
        fStack_1c0 = (float)uStack_90 * (float)uStack_a0 - fVar18 * (float)uStack_c0;
        fStack_1bc = uStack_90._4_4_ * uStack_a0._4_4_ - fVar19 * uStack_c0._4_4_;
        *(ulong *)local_1b0 = CONCAT44(fStack_1c4,local_1c8);
        *(ulong *)(local_1b0 + 2) = CONCAT44(fStack_1bc,fStack_1c0);
        local_f8 = CONCAT44(fVar17,fVar16);
        uStack_f0 = CONCAT44(fVar19,fVar18);
        local_178 = (float)local_98 * (float)local_c8;
        fStack_174 = local_98._4_4_ * local_c8._4_4_;
        fStack_170 = (float)uStack_90 * (float)uStack_c0;
        fStack_16c = uStack_90._4_4_ * uStack_c0._4_4_;
        local_188 = fVar16 * (float)local_a8;
        fStack_184 = fVar17 * local_a8._4_4_;
        fStack_180 = fVar18 * (float)uStack_a0;
        fStack_17c = fVar19 * uStack_a0._4_4_;
        fStack_1dc = (float)local_98 * (float)local_c8 + fVar16 * (float)local_a8;
        fStack_1e0 = local_98._4_4_ * local_c8._4_4_ + fVar17 * local_a8._4_4_;
        fStack_1e4 = (float)uStack_90 * (float)uStack_c0 + fVar18 * (float)uStack_a0;
        local_1e8 = uStack_90._4_4_ * uStack_c0._4_4_ + fVar19 * uStack_a0._4_4_;
        local_1d0 = local_228 + (0xe - (long)local_240);
        *(ulong *)(local_228 + (0xe - (long)local_240)) = CONCAT44(fStack_1e4,local_1e8);
        *(ulong *)(local_228 + (0x10 - (long)local_240)) = CONCAT44(fStack_1dc,fStack_1e0);
        local_c8 = uVar1;
        uStack_c0 = uVar2;
        local_a8 = uVar3;
        uStack_a0 = uVar4;
        local_98 = uVar5;
        uStack_90 = uVar6;
        local_48 = uVar7;
        uStack_40 = uVar8;
        local_38 = uVar9;
        uStack_30 = uVar10;
        local_28 = uVar11;
        uStack_20 = uVar12;
        local_18 = uVar13;
        uStack_10 = uVar14;
      }
    }
    for (; local_240 < 9; local_240 = local_240 + 1) {
      fVar16 = *(float *)(local_230 + (long)local_240 * 4);
      fVar17 = local_268[local_240] * L3_imdct36::g_twid9[local_240 + 9] +
               (&local_298)[local_240] * L3_imdct36::g_twid9[local_240];
      *(float *)(local_230 + (long)local_240 * 4) =
           local_268[local_240] * L3_imdct36::g_twid9[local_240] +
           -((&local_298)[local_240] * L3_imdct36::g_twid9[local_240 + 9]);
      local_228[local_240] =
           fVar16 * *(float *)(local_238 + (long)local_240 * 4) +
           -(fVar17 * *(float *)(local_238 + (long)(local_240 + 9) * 4));
      local_228[0x11 - local_240] =
           fVar16 * *(float *)(local_238 + (long)(local_240 + 9) * 4) +
           fVar17 * *(float *)(local_238 + (long)local_240 * 4);
    }
    local_228 = local_228 + 0x12;
    local_230 = local_230 + 0x24;
  }
  return;
}

Assistant:

static void L3_imdct36(float *grbuf, float *overlap, const float *window, int nbands)
{
    int i, j;
    static const float g_twid9[18] = {
        0.73727734f,0.79335334f,0.84339145f,0.88701083f,0.92387953f,0.95371695f,0.97629601f,0.99144486f,0.99904822f,0.67559021f,0.60876143f,0.53729961f,0.46174861f,0.38268343f,0.30070580f,0.21643961f,0.13052619f,0.04361938f
    };

    for (j = 0; j < nbands; j++, grbuf += 18, overlap += 9)
    {
        float co[9], si[9];
        co[0] = -grbuf[0];
        si[0] = grbuf[17];
        for (i = 0; i < 4; i++)
        {
            si[8 - 2*i] =   grbuf[4*i + 1] - grbuf[4*i + 2];
            co[1 + 2*i] =   grbuf[4*i + 1] + grbuf[4*i + 2];
            si[7 - 2*i] =   grbuf[4*i + 4] - grbuf[4*i + 3];
            co[2 + 2*i] = -(grbuf[4*i + 3] + grbuf[4*i + 4]);
        }
        L3_dct3_9(co);
        L3_dct3_9(si);

        si[1] = -si[1];
        si[3] = -si[3];
        si[5] = -si[5];
        si[7] = -si[7];

        i = 0;

#if HAVE_SIMD
        if (have_simd()) for (; i < 8; i += 4)
        {
            f4 vovl = VLD(overlap + i);
            f4 vc = VLD(co + i);
            f4 vs = VLD(si + i);
            f4 vr0 = VLD(g_twid9 + i);
            f4 vr1 = VLD(g_twid9 + 9 + i);
            f4 vw0 = VLD(window + i);
            f4 vw1 = VLD(window + 9 + i);
            f4 vsum = VADD(VMUL(vc, vr1), VMUL(vs, vr0));
            VSTORE(overlap + i, VSUB(VMUL(vc, vr0), VMUL(vs, vr1)));
            VSTORE(grbuf + i, VSUB(VMUL(vovl, vw0), VMUL(vsum, vw1)));
            vsum = VADD(VMUL(vovl, vw1), VMUL(vsum, vw0));
            VSTORE(grbuf + 14 - i, VREV(vsum));
        }
#endif /* HAVE_SIMD */
        for (; i < 9; i++)
        {
            float ovl  = overlap[i];
            float sum  = co[i]*g_twid9[9 + i] + si[i]*g_twid9[0 + i];
            overlap[i] = co[i]*g_twid9[0 + i] - si[i]*g_twid9[9 + i];
            grbuf[i]      = ovl*window[0 + i] - sum*window[9 + i];
            grbuf[17 - i] = ovl*window[9 + i] + sum*window[0 + i];
        }
    }
}